

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

bool anon_unknown.dwarf_d7297f::PathSimplifier::splitCubic
               (QPoint *u,QPoint *v,QPoint *w,QPoint *q,QPoint *result)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  QPoint QVar5;
  int *piVar6;
  QPoint *in_R8;
  long in_FS_OFFSET;
  bool accurate;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  bool local_62;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar5 = ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (QPoint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  *in_R8 = QVar5;
  QVar5 = ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (QPoint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_R8[2] = QVar5;
  QVar5 = ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (QPoint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_R8[4] = QVar5;
  QVar5 = ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (QPoint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_R8[1] = QVar5;
  QVar5 = ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (QPoint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_R8[3] = QVar5;
  QVar5 = ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (QPoint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_R8[2] = QVar5;
  uVar2 = QPoint::x((QPoint *)0x5e908a);
  uVar3 = QPoint::y((QPoint *)0x5e9098);
  uVar2 = uVar2 | uVar3;
  uVar3 = QPoint::x((QPoint *)0x5e90b2);
  uVar4 = QPoint::y((QPoint *)0x5e90cc);
  local_62 = false;
  if (((uVar2 | uVar3 | uVar4) & 1) == 0) {
    uVar2 = QPoint::x((QPoint *)0x5e90f2);
    uVar3 = QPoint::y((QPoint *)0x5e9104);
    uVar2 = uVar2 | uVar3;
    uVar3 = QPoint::x((QPoint *)0x5e911e);
    uVar2 = uVar2 | uVar3;
    uVar3 = QPoint::y((QPoint *)0x5e9138);
    local_62 = false;
    if (((uVar2 | uVar3) & 3) == 0) {
      uVar3 = QPoint::x((QPoint *)0x5e915a);
      uVar2 = QPoint::y((QPoint *)0x5e916c);
      local_62 = ((uVar3 | uVar2) & 7) == 0;
    }
  }
  piVar6 = QPoint::rx((QPoint *)0x5e9195);
  *piVar6 = *piVar6 >> 1;
  piVar6 = QPoint::ry((QPoint *)0x5e91a5);
  *piVar6 = *piVar6 >> 1;
  piVar6 = QPoint::rx((QPoint *)0x5e91b9);
  *piVar6 = *piVar6 >> 2;
  piVar6 = QPoint::ry((QPoint *)0x5e91ce);
  *piVar6 = *piVar6 >> 2;
  piVar6 = QPoint::rx((QPoint *)0x5e91e3);
  *piVar6 = *piVar6 >> 3;
  piVar6 = QPoint::ry((QPoint *)0x5e91f8);
  *piVar6 = *piVar6 >> 3;
  piVar6 = QPoint::rx((QPoint *)0x5e920d);
  *piVar6 = *piVar6 >> 2;
  piVar6 = QPoint::ry((QPoint *)0x5e9222);
  *piVar6 = *piVar6 >> 2;
  piVar6 = QPoint::rx((QPoint *)0x5e9237);
  *piVar6 = *piVar6 >> 1;
  piVar6 = QPoint::ry((QPoint *)0x5e924b);
  *piVar6 = *piVar6 >> 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_62;
  }
  __stack_chk_fail();
}

Assistant:

inline bool PathSimplifier::splitCubic(const QPoint &u, const QPoint &v,
                                       const QPoint &w, const QPoint &q, QPoint *result)
{
    result[0] = u + v;
    result[2] = v + w;
    result[4] = w + q;
    result[1] = result[0] + result[2];
    result[3] = result[2] + result[4];
    result[2] = result[1] + result[3];
    bool accurate = ((result[0].x() | result[0].y() | result[4].x() | result[4].y()) & 1) == 0
                    && ((result[1].x() | result[1].y() | result[3].x() | result[3].y()) & 3) == 0
                    && ((result[2].x() | result[2].y()) & 7) == 0;
    result[0].rx() >>= 1;
    result[0].ry() >>= 1;
    result[1].rx() >>= 2;
    result[1].ry() >>= 2;
    result[2].rx() >>= 3;
    result[2].ry() >>= 3;
    result[3].rx() >>= 2;
    result[3].ry() >>= 2;
    result[4].rx() >>= 1;
    result[4].ry() >>= 1;
    return accurate;
}